

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void __thiscall cmSystemTools::EnvDiff::PutEnv(EnvDiff *this,string *env)

{
  long lVar1;
  optional<std::__cxx11::string> *this_00;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = std::__cxx11::string::find((char)env,0x3d);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&name,(ulong)env);
    std::__cxx11::string::substr((ulong)&local_38,(ulong)env);
    this_00 = (optional<std::__cxx11::string> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->diff,&name);
    std::optional<std::__cxx11::string>::operator=(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  UnPutEnv(this,env);
  return;
}

Assistant:

void cmSystemTools::EnvDiff::PutEnv(const std::string& env)
{
  auto const eq_loc = env.find('=');
  if (eq_loc != std::string::npos) {
    std::string name = env.substr(0, eq_loc);
    diff[name] = env.substr(eq_loc + 1);
  } else {
    this->UnPutEnv(env);
  }
}